

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution3d.cpp
# Opt level: O1

int __thiscall
ncnn::Deconvolution3D::forward(Deconvolution3D *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  size_t sVar12;
  int *piVar13;
  void *pvVar14;
  size_t sVar15;
  size_t sVar16;
  void *pvVar17;
  float *pfVar18;
  bool bVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  long lVar24;
  int iVar25;
  uint uVar26;
  ulong uVar27;
  int iVar28;
  int iVar29;
  ulong uVar30;
  int iVar31;
  int iVar32;
  void *pvVar33;
  ulong uVar34;
  void *pvVar35;
  long lVar36;
  bool bVar37;
  undefined4 uVar38;
  float fVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  int iVar43;
  undefined1 auVar42 [16];
  float fVar44;
  float fVar45;
  int iVar46;
  int iVar48;
  undefined1 auVar47 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  int size;
  vector<int,_std::allocator<int>_> _space_ofs;
  ulong local_198;
  allocator_type local_179;
  undefined1 local_178 [16];
  ulong local_160;
  ulong local_158;
  long local_150;
  Mat local_148;
  Mat *local_100;
  ulong local_f8;
  ulong local_f0;
  ulong local_e8;
  ulong local_e0;
  void *local_d8;
  Option *local_d0;
  ulong local_c8;
  long local_c0;
  long local_b8;
  ulong local_b0;
  Mat *local_a8;
  void *local_a0;
  void *local_98;
  ulong local_90;
  ulong local_88;
  long local_80;
  void *local_78;
  long local_70;
  long local_68;
  void *local_60;
  undefined1 local_58 [16];
  vector<int,_std::allocator<int>_> local_48;
  
  iVar2 = this->kernel_w;
  iVar43 = this->dilation_w;
  iVar46 = bottom_blob->w;
  iVar48 = this->stride_w;
  iVar3 = this->kernel_h;
  iVar4 = this->dilation_h;
  iVar5 = bottom_blob->h;
  iVar28 = this->stride_h;
  iVar29 = this->kernel_d;
  iVar31 = this->dilation_d;
  iVar32 = bottom_blob->d;
  iVar6 = this->stride_d;
  sVar12 = bottom_blob->elemsize;
  iVar7 = this->output_pad_right;
  iVar8 = this->output_pad_bottom;
  iVar9 = this->output_pad_behind;
  local_148.cstep = 0;
  local_148.data = (void *)0x0;
  local_148.refcount._0_4_ = 0;
  local_148.refcount._4_4_ = 0;
  local_148.elemsize = 0;
  local_148.elempack = 0;
  local_148.allocator = (Allocator *)0x0;
  local_148.dims = 0;
  local_148.w = 0;
  local_148.h = 0;
  local_148.d = 0;
  local_148.c = 0;
  auVar40._0_4_ = -(uint)(0 < this->pad_left);
  auVar40._4_4_ = -(uint)(0 < this->pad_right);
  auVar40._8_4_ = -(uint)(0 < this->pad_top);
  auVar40._12_4_ = -(uint)(0 < this->pad_bottom);
  iVar25 = movmskps((int)&local_148 + 0x28,auVar40);
  lVar36 = 0x10;
  if ((((iVar25 == 0) && (this->pad_front < 1)) && (this->pad_behind < 1)) &&
     (((this->output_w < 1 || (this->output_h < 1)) || (this->output_d < 1)))) {
    if (&local_148 != top_blob) {
      piVar13 = top_blob->refcount;
      if (piVar13 != (int *)0x0) {
        LOCK();
        *piVar13 = *piVar13 + 1;
        UNLOCK();
      }
      local_148.data = top_blob->data;
      local_148.refcount._0_4_ = SUB84(top_blob->refcount,0);
      local_148.refcount._4_4_ = (undefined4)((ulong)top_blob->refcount >> 0x20);
      local_148.elemsize = top_blob->elemsize;
      local_148.elempack = top_blob->elempack;
      local_148.allocator = top_blob->allocator;
      uVar20 = top_blob->dims;
      uVar21 = top_blob->w;
      uVar22 = top_blob->h;
      uVar23 = top_blob->d;
      local_148.c = top_blob->c;
      local_148.cstep = top_blob->cstep;
      local_148.dims = uVar20;
      local_148.w = uVar21;
      local_148.h = uVar22;
      local_148.d = uVar23;
    }
    lVar36 = 8;
  }
  local_100 = top_blob;
  local_d0 = opt;
  local_a8 = bottom_blob;
  Mat::create(&local_148,iVar7 + (iVar2 + -1) * iVar43 + (iVar46 + -1) * iVar48 + 1,
              iVar8 + 1 + (iVar3 + -1) * iVar4 + (iVar5 + -1) * iVar28,
              iVar9 + 1 + (iVar29 + -1) * iVar31 + (iVar32 + -1) * iVar6,this->num_output,sVar12,
              *(Allocator **)(&opt->lightmode + lVar36));
  iVar2 = local_148.h;
  iVar43 = -100;
  if ((local_148.data != (void *)0x0) && ((long)local_148.c * local_148.cstep != 0)) {
    local_160 = (ulong)(uint)this->kernel_w;
    iVar43 = this->kernel_h;
    iVar46 = this->kernel_d;
    local_150 = (long)this->stride_w;
    local_178._0_8_ = (long)this->stride_h;
    iVar48 = this->stride_d;
    iVar3 = this->dilation_w;
    iVar4 = this->dilation_h;
    iVar5 = this->dilation_d;
    local_158 = (ulong)(uint)this->activation_type;
    local_f0 = CONCAT44(local_f0._4_4_,local_148.w);
    local_c8 = (ulong)(uint)local_148.c;
    uVar26 = this->kernel_w * iVar43 * iVar46;
    std::vector<int,_std::allocator<int>_>::vector(&local_48,(long)(int)uVar26,&local_179);
    if (0 < iVar46) {
      iVar28 = 0;
      iVar29 = 0;
      iVar31 = 0;
      do {
        if (0 < iVar43) {
          iVar32 = 0;
          do {
            if (0 < (int)local_160) {
              lVar36 = 0;
              do {
                local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[iVar28 + lVar36] = iVar29;
                iVar29 = iVar29 + iVar3;
                lVar36 = lVar36 + 1;
              } while ((int)local_160 != (int)lVar36);
              iVar28 = iVar28 + (int)lVar36;
            }
            iVar29 = iVar29 + ((int)local_f0 * iVar4 - iVar3 * (int)local_160);
            iVar32 = iVar32 + 1;
          } while (iVar32 != iVar43);
        }
        iVar29 = iVar29 + (iVar2 * iVar5 - iVar4 * iVar43) * (int)local_f0;
        iVar31 = iVar31 + 1;
      } while (iVar31 != iVar46);
    }
    if (0 < (int)local_c8) {
      local_c0 = local_148.cstep * local_148.elemsize;
      lVar36 = (long)local_148.h * (long)local_148.w;
      local_80 = local_148.elemsize * lVar36;
      local_e8 = 0;
      local_a0 = (this->bias_data).data;
      bVar37 = local_a0 != (void *)0x0;
      iVar2 = (this->bias_data).c;
      sVar12 = (this->bias_data).cstep;
      iVar3 = (int)((local_80 + 0xfU & 0xfffffffffffffff0) / local_148.elemsize);
      if (local_148.dims == 4) {
        iVar3 = (int)lVar36;
      }
      local_88 = (ulong)(uint)(iVar3 * local_148.d);
      local_e0 = (ulong)(uint)(local_148.h * local_148.w * local_148.d);
      uVar10 = local_a8->w;
      local_68 = local_148.elemsize * (long)local_148.w * local_178._0_8_;
      local_f0 = (ulong)(uint)local_a8->h;
      local_80 = local_80 * iVar48;
      lVar36 = local_88 - 1;
      uVar11 = local_a8->c;
      local_90 = (ulong)(iVar3 * local_148.d + 3U & 0xfffffffc);
      auVar47._8_4_ = (int)lVar36;
      auVar47._0_8_ = lVar36;
      auVar47._12_4_ = (int)((ulong)lVar36 >> 0x20);
      local_160 = (ulong)((int)local_160 * iVar43 * iVar46 * uVar11);
      auVar47 = auVar47 ^ _DAT_005ec030;
      local_158 = (ulong)((int)local_158 - 1);
      local_b0 = (ulong)(uint)local_a8->d;
      local_b8 = (long)local_148.data + 0xc;
      local_98 = local_148.data;
      local_f8 = 0;
      pvVar35 = local_148.data;
      auVar40 = _DAT_005ec010;
      auVar49 = _DAT_005ec020;
      auVar50 = _DAT_005ec030;
      local_58 = auVar47;
      do {
        uVar38 = 0;
        if ((long)iVar2 * sVar12 != 0 && bVar37) {
          uVar38 = *(undefined4 *)((long)local_a0 + local_f8 * 4);
        }
        if (0 < (int)local_88) {
          uVar27 = 0;
          do {
            auVar41._8_4_ = (int)uVar27;
            auVar41._0_8_ = uVar27;
            auVar41._12_4_ = (int)(uVar27 >> 0x20);
            auVar42 = (auVar41 | auVar49) ^ auVar50;
            iVar46 = auVar47._0_4_;
            bVar19 = iVar46 < auVar42._0_4_;
            iVar43 = auVar42._4_4_;
            iVar48 = auVar47._4_4_;
            if ((bool)(~(iVar48 < iVar43 || iVar43 == iVar48 && bVar19) & 1)) {
              *(undefined4 *)(local_b8 + -0xc + uVar27 * 4) = uVar38;
            }
            if (iVar48 >= iVar43 && (iVar43 != iVar48 || !bVar19)) {
              *(undefined4 *)(local_b8 + -8 + uVar27 * 4) = uVar38;
            }
            auVar41 = (auVar41 | auVar40) ^ auVar50;
            iVar43 = auVar41._4_4_;
            if (iVar43 <= iVar48 && (iVar43 != iVar48 || auVar41._0_4_ <= iVar46)) {
              *(undefined4 *)(local_b8 + -4 + uVar27 * 4) = uVar38;
              *(undefined4 *)(local_b8 + uVar27 * 4) = uVar38;
            }
            uVar27 = uVar27 + 4;
          } while (local_90 != uVar27);
        }
        if (0 < (int)local_b0) {
          local_70 = (long)(int)local_e8 * 4;
          local_78 = (void *)(local_c0 * local_f8 + (long)local_98);
          local_198 = 0;
          do {
            if (0 < (int)local_f0) {
              local_60 = (void *)(local_80 * local_198 + (long)local_78);
              pvVar14 = (this->weight_data).data;
              auVar42._8_8_ = 0;
              auVar42._0_8_ = local_178._8_8_;
              local_178 = auVar42 << 0x40;
              do {
                if (0 < (int)uVar10) {
                  iVar43 = local_a8->h;
                  sVar15 = local_a8->elemsize;
                  sVar16 = local_a8->cstep;
                  lVar36 = (long)local_a8->w * sVar15;
                  pvVar17 = local_a8->data;
                  uVar27 = 0;
                  do {
                    if (0 < (int)uVar11) {
                      lVar24 = uVar27 * local_150 * 4 + local_68 * local_178._0_8_;
                      uVar30 = 0;
                      pvVar33 = (void *)((long)pvVar14 + local_70);
                      do {
                        if (0 < (int)uVar26) {
                          fVar39 = *(float *)((long)pvVar17 +
                                             sVar16 * sVar15 * uVar30 +
                                             uVar27 * 4 +
                                             lVar36 * local_178._0_8_ +
                                             (long)iVar43 * local_198 * lVar36);
                          uVar34 = 0;
                          do {
                            *(float *)((long)local_60 +
                                      (long)local_48.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_start[uVar34] * 4 +
                                      lVar24) =
                                 *(float *)((long)pvVar33 + uVar34 * 4) * fVar39 +
                                 *(float *)((long)local_60 +
                                           (long)local_48.
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_start[uVar34] *
                                           4 + lVar24);
                            uVar34 = uVar34 + 1;
                          } while (uVar26 != uVar34);
                        }
                        uVar30 = uVar30 + 1;
                        pvVar33 = (void *)((long)pvVar33 + (long)(int)uVar26 * 4);
                      } while (uVar30 != uVar11);
                    }
                    uVar27 = uVar27 + 1;
                  } while (uVar27 != uVar10);
                }
                uVar27 = local_178._0_8_ + 1;
                local_178._0_8_ = uVar27;
              } while (uVar27 != local_f0);
            }
            local_198 = local_198 + 1;
          } while (local_198 != local_b0);
        }
        local_d8 = pvVar35;
        if (0 < (int)local_e0) {
          pfVar18 = (float *)(this->activation_params).data;
          uVar34 = 0;
          uVar27 = local_158;
          uVar30 = local_e0;
          do {
            fVar39 = *(float *)((long)pvVar35 + uVar34 * 4);
            fVar45 = fVar39;
            if ((uint)uVar27 < 6) {
              switch((long)&switchD_005a03df::switchdataD_005fe154 +
                     (long)(int)(&switchD_005a03df::switchdataD_005fe154)[uVar27]) {
              case 0x5a03e1:
                if (fVar39 <= 0.0) {
                  fVar45 = 0.0;
                }
                break;
              case 0x5a03f1:
                local_178 = ZEXT416((uint)fVar39);
                fVar39 = expf(fVar39);
                fVar39 = logf(fVar39 + 1.0);
                fVar39 = tanhf(fVar39);
                uVar27 = local_158;
                uVar30 = local_e0;
                pvVar35 = local_d8;
                auVar47 = local_58;
                auVar40 = _DAT_005ec010;
                auVar49 = _DAT_005ec020;
                auVar50 = _DAT_005ec030;
                fVar45 = fVar39 * (float)local_178._0_4_;
                break;
              case 0x5a045d:
                if (fVar39 <= *pfVar18) {
                  fVar39 = *pfVar18;
                }
                fVar45 = pfVar18[1];
                if (fVar39 <= pfVar18[1]) {
                  fVar45 = fVar39;
                }
                break;
              case 0x5a047c:
                if (88.37626 <= fVar39) {
                  fVar39 = 88.37626;
                }
                fVar39 = expf((float)(-(uint)(fVar39 < -88.37626) & 0x42b0c0a5 |
                                     ~-(uint)(fVar39 < -88.37626) & ((uint)fVar39 ^ auVar50._0_4_)))
                ;
                uVar27 = local_158;
                uVar30 = local_e0;
                pvVar35 = local_d8;
                auVar47 = local_58;
                auVar40 = _DAT_005ec010;
                auVar49 = _DAT_005ec020;
                auVar50 = _DAT_005ec030;
                fVar45 = 1.0 / (fVar39 + 1.0);
                break;
              case 0x5a0503:
                fVar45 = (float)(~-(uint)(0.0 < fVar39) & (uint)*pfVar18 |
                                -(uint)(0.0 < fVar39) & 0x3f800000) * fVar39;
                break;
              case 0x5a052f:
                fVar1 = *pfVar18;
                fVar44 = (float)((uint)pfVar18[1] ^ auVar50._0_4_) / fVar1;
                fVar45 = 0.0;
                if ((fVar44 <= fVar39) && (fVar45 = fVar39, fVar39 <= fVar44 + 1.0 / fVar1)) {
                  fVar45 = (fVar1 * fVar39 + pfVar18[1]) * fVar39;
                }
              }
            }
            *(float *)((long)pvVar35 + uVar34 * 4) = fVar45;
            uVar34 = uVar34 + 1;
          } while (uVar30 != uVar34);
        }
        local_f8 = local_f8 + 1;
        local_b8 = local_b8 + local_c0;
        local_e8 = (ulong)(uint)((int)local_e8 + (int)local_160);
        pvVar35 = (void *)((long)pvVar35 + local_c0);
      } while (local_f8 != local_c8);
    }
    if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    cut_padding(this,&local_148,local_100,local_d0);
    iVar43 = -100;
    if ((local_100->data != (void *)0x0) &&
       (iVar43 = -100, (long)local_100->c * local_100->cstep != 0)) {
      iVar43 = 0;
    }
  }
  piVar13 = (int *)CONCAT44(local_148.refcount._4_4_,local_148.refcount._0_4_);
  if (piVar13 != (int *)0x0) {
    LOCK();
    *piVar13 = *piVar13 + -1;
    UNLOCK();
    if (*piVar13 == 0) {
      if (local_148.allocator == (Allocator *)0x0) {
        if (local_148.data != (void *)0x0) {
          free(local_148.data);
        }
      }
      else {
        (*(local_148.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar43;
}

Assistant:

int Deconvolution3D::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    size_t elemsize = bottom_blob.elemsize;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;
    const int kernel_extent_d = dilation_d * (kernel_d - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;
    int outd = (d - 1) * stride_d + kernel_extent_d + output_pad_behind;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || pad_front > 0 || pad_behind > 0 || (output_w > 0 && output_h > 0 && output_d > 0))
    {
        top_blob_bordered.create(outw, outh, outd, num_output, elemsize, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, outd, num_output, elemsize, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    int ret = deconvolution3d(bottom_blob, top_blob_bordered, weight_data, bias_data, kernel_w, kernel_h, kernel_d, stride_w, stride_h, stride_d, dilation_w, dilation_h, dilation_d, activation_type, activation_params, opt);
    if (ret != 0)
        return ret;

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}